

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edk2_vss2.cpp
# Opt level: O0

void __thiscall edk2_vss2_t::vss2_variable_t::_read(vss2_variable_t *this)

{
  uint8_t uVar1;
  bool bVar2;
  int32_t iVar3;
  uint32_t uVar4;
  validation_expr_error<unsigned_char> *this_00;
  kstream *pkVar5;
  vss2_variable_attributes_t *this_01;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  unique_ptr<edk2_vss2_t::vss2_variable_attributes_t,_std::default_delete<edk2_vss2_t::vss2_variable_attributes_t>_>
  local_78;
  undefined1 local_6a;
  allocator<char> local_69;
  string local_68;
  uint8_t local_32;
  uint8_t local_31;
  undefined1 local_30 [7];
  uint8_t _;
  vss2_variable_t *local_10;
  vss2_variable_t *this_local;
  
  this->n_invoke_offset = true;
  local_10 = this;
  iVar3 = offset(this);
  if (-1 < iVar3) {
    this->n_invoke_offset = false;
    kaitai::kstream::read_bytes_abi_cxx11_((string *)local_30,(this->super_kstruct).m__io,0);
    std::__cxx11::string::operator=((string *)&this->m_invoke_offset,(string *)local_30);
    std::__cxx11::string::~string((string *)local_30);
  }
  uVar1 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_signature_first = uVar1;
  this->n_signature_last = true;
  uVar1 = signature_first(this);
  if (uVar1 == 0xaa) {
    this->n_signature_last = false;
    uVar1 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
    this->m_signature_last = uVar1;
    local_31 = signature_last(this);
    if (local_31 != 'U') {
      local_6a = 1;
      this_00 = (validation_expr_error<unsigned_char> *)__cxa_allocate_exception(0x40);
      local_32 = signature_last(this);
      pkVar5 = kaitai::kstruct::_io(&this->super_kstruct);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"/types/vss2_variable/seq/2",&local_69);
      kaitai::validation_expr_error<unsigned_char>::validation_expr_error
                (this_00,&local_32,pkVar5,&local_68);
      local_6a = 0;
      __cxa_throw(this_00,&kaitai::validation_expr_error<unsigned_char>::typeinfo,
                  kaitai::validation_expr_error<unsigned_char>::~validation_expr_error);
    }
    local_31 = 0x55;
  }
  this->n_state = true;
  uVar1 = signature_first(this);
  if (uVar1 == 0xaa) {
    this->n_state = false;
    uVar1 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
    this->m_state = uVar1;
  }
  this->n_reserved = true;
  uVar1 = signature_first(this);
  if (uVar1 == 0xaa) {
    this->n_reserved = false;
    uVar1 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
    this->m_reserved = uVar1;
  }
  this->n_attributes = true;
  uVar1 = signature_first(this);
  if (uVar1 == 0xaa) {
    this->n_attributes = false;
    this_01 = (vss2_variable_attributes_t *)operator_new(0x30);
    vss2_variable_attributes_t::vss2_variable_attributes_t
              (this_01,(this->super_kstruct).m__io,this,this->m__root);
    std::
    unique_ptr<edk2_vss2_t::vss2_variable_attributes_t,std::default_delete<edk2_vss2_t::vss2_variable_attributes_t>>
    ::unique_ptr<std::default_delete<edk2_vss2_t::vss2_variable_attributes_t>,void>
              ((unique_ptr<edk2_vss2_t::vss2_variable_attributes_t,std::default_delete<edk2_vss2_t::vss2_variable_attributes_t>>
                *)&local_78,this_01);
    std::
    unique_ptr<edk2_vss2_t::vss2_variable_attributes_t,_std::default_delete<edk2_vss2_t::vss2_variable_attributes_t>_>
    ::operator=(&this->m_attributes,&local_78);
    std::
    unique_ptr<edk2_vss2_t::vss2_variable_attributes_t,_std::default_delete<edk2_vss2_t::vss2_variable_attributes_t>_>
    ::~unique_ptr(&local_78);
  }
  this->n_len_name = true;
  uVar1 = signature_first(this);
  if (uVar1 == 0xaa) {
    this->n_len_name = false;
    uVar4 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
    this->m_len_name = uVar4;
  }
  this->n_len_data = true;
  uVar1 = signature_first(this);
  if (uVar1 == 0xaa) {
    this->n_len_data = false;
    uVar4 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
    this->m_len_data = uVar4;
  }
  this->n_timestamp = true;
  uVar1 = signature_first(this);
  if ((uVar1 == 0xaa) && (bVar2 = is_auth(this), bVar2)) {
    this->n_timestamp = false;
    kaitai::kstream::read_bytes_abi_cxx11_(&local_98,(this->super_kstruct).m__io,0x10);
    std::__cxx11::string::operator=((string *)&this->m_timestamp,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
  }
  this->n_pubkey_index = true;
  uVar1 = signature_first(this);
  if ((uVar1 == 0xaa) && (bVar2 = is_auth(this), bVar2)) {
    this->n_pubkey_index = false;
    uVar4 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
    this->m_pubkey_index = uVar4;
  }
  this->n_len_name_auth = true;
  uVar1 = signature_first(this);
  if ((uVar1 == 0xaa) && (bVar2 = is_auth(this), bVar2)) {
    this->n_len_name_auth = false;
    uVar4 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
    this->m_len_name_auth = uVar4;
  }
  this->n_len_data_auth = true;
  uVar1 = signature_first(this);
  if ((uVar1 == 0xaa) && (bVar2 = is_auth(this), bVar2)) {
    this->n_len_data_auth = false;
    uVar4 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
    this->m_len_data_auth = uVar4;
  }
  this->n_vendor_guid = true;
  uVar1 = signature_first(this);
  if (uVar1 == 0xaa) {
    this->n_vendor_guid = false;
    kaitai::kstream::read_bytes_abi_cxx11_(&local_b8,(this->super_kstruct).m__io,0x10);
    std::__cxx11::string::operator=((string *)&this->m_vendor_guid,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  this->n_name_auth = true;
  uVar1 = signature_first(this);
  if ((uVar1 == 0xaa) && (bVar2 = is_auth(this), bVar2)) {
    this->n_name_auth = false;
    pkVar5 = (this->super_kstruct).m__io;
    uVar4 = len_name_auth(this);
    kaitai::kstream::read_bytes_abi_cxx11_(&local_d8,pkVar5,(ulong)uVar4);
    std::__cxx11::string::operator=((string *)&this->m_name_auth,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  this->n_data_auth = true;
  uVar1 = signature_first(this);
  if ((uVar1 == 0xaa) && (bVar2 = is_auth(this), bVar2)) {
    this->n_data_auth = false;
    pkVar5 = (this->super_kstruct).m__io;
    uVar4 = len_data_auth(this);
    kaitai::kstream::read_bytes_abi_cxx11_(&local_f8,pkVar5,(ulong)uVar4);
    std::__cxx11::string::operator=((string *)&this->m_data_auth,(string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
  }
  this->n_invoke_end_offset_auth = true;
  uVar1 = signature_first(this);
  if (((uVar1 == 0xaa) && (bVar2 = is_auth(this), bVar2)) &&
     (iVar3 = end_offset_auth(this), -1 < iVar3)) {
    this->n_invoke_end_offset_auth = false;
    kaitai::kstream::read_bytes_abi_cxx11_(&local_118,(this->super_kstruct).m__io,0);
    std::__cxx11::string::operator=((string *)&this->m_invoke_end_offset_auth,(string *)&local_118);
    std::__cxx11::string::~string((string *)&local_118);
  }
  this->n_alignment_padding_auth = true;
  uVar1 = signature_first(this);
  if ((uVar1 == 0xaa) && (bVar2 = is_auth(this), bVar2)) {
    this->n_alignment_padding_auth = false;
    pkVar5 = (this->super_kstruct).m__io;
    iVar3 = len_alignment_padding_auth(this);
    kaitai::kstream::read_bytes_abi_cxx11_(&local_138,pkVar5,(long)iVar3);
    std::__cxx11::string::operator=((string *)&this->m_alignment_padding_auth,(string *)&local_138);
    std::__cxx11::string::~string((string *)&local_138);
  }
  this->n_name = true;
  uVar1 = signature_first(this);
  if ((uVar1 == 0xaa) && (bVar2 = is_auth(this), !bVar2)) {
    this->n_name = false;
    pkVar5 = (this->super_kstruct).m__io;
    uVar4 = len_name(this);
    kaitai::kstream::read_bytes_abi_cxx11_(&local_158,pkVar5,(ulong)uVar4);
    std::__cxx11::string::operator=((string *)&this->m_name,(string *)&local_158);
    std::__cxx11::string::~string((string *)&local_158);
  }
  this->n_data = true;
  uVar1 = signature_first(this);
  if ((uVar1 == 0xaa) && (bVar2 = is_auth(this), !bVar2)) {
    this->n_data = false;
    pkVar5 = (this->super_kstruct).m__io;
    uVar4 = len_data(this);
    kaitai::kstream::read_bytes_abi_cxx11_(&local_178,pkVar5,(ulong)uVar4);
    std::__cxx11::string::operator=((string *)&this->m_data,(string *)&local_178);
    std::__cxx11::string::~string((string *)&local_178);
  }
  this->n_invoke_end_offset = true;
  uVar1 = signature_first(this);
  if (((uVar1 == 0xaa) && (bVar2 = is_auth(this), !bVar2)) && (iVar3 = end_offset(this), -1 < iVar3)
     ) {
    this->n_invoke_end_offset = false;
    kaitai::kstream::read_bytes_abi_cxx11_(&local_198,(this->super_kstruct).m__io,0);
    std::__cxx11::string::operator=((string *)&this->m_invoke_end_offset,(string *)&local_198);
    std::__cxx11::string::~string((string *)&local_198);
  }
  this->n_alignment_padding = true;
  uVar1 = signature_first(this);
  if ((uVar1 == 0xaa) && (bVar2 = is_auth(this), !bVar2)) {
    this->n_alignment_padding = false;
    pkVar5 = (this->super_kstruct).m__io;
    iVar3 = len_alignment_padding(this);
    kaitai::kstream::read_bytes_abi_cxx11_(&local_1b8,pkVar5,(long)iVar3);
    std::__cxx11::string::operator=((string *)&this->m_alignment_padding,(string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
  }
  return;
}

Assistant:

void edk2_vss2_t::vss2_variable_t::_read() {
    n_invoke_offset = true;
    if (offset() >= 0) {
        n_invoke_offset = false;
        m_invoke_offset = m__io->read_bytes(0);
    }
    m_signature_first = m__io->read_u1();
    n_signature_last = true;
    if (signature_first() == 170) {
        n_signature_last = false;
        m_signature_last = m__io->read_u1();
        {
            uint8_t _ = signature_last();
            if (!(_ == 85)) {
                throw kaitai::validation_expr_error<uint8_t>(signature_last(), _io(), std::string("/types/vss2_variable/seq/2"));
            }
        }
    }
    n_state = true;
    if (signature_first() == 170) {
        n_state = false;
        m_state = m__io->read_u1();
    }
    n_reserved = true;
    if (signature_first() == 170) {
        n_reserved = false;
        m_reserved = m__io->read_u1();
    }
    n_attributes = true;
    if (signature_first() == 170) {
        n_attributes = false;
        m_attributes = std::unique_ptr<vss2_variable_attributes_t>(new vss2_variable_attributes_t(m__io, this, m__root));
    }
    n_len_name = true;
    if (signature_first() == 170) {
        n_len_name = false;
        m_len_name = m__io->read_u4le();
    }
    n_len_data = true;
    if (signature_first() == 170) {
        n_len_data = false;
        m_len_data = m__io->read_u4le();
    }
    n_timestamp = true;
    if ( ((signature_first() == 170) && (is_auth())) ) {
        n_timestamp = false;
        m_timestamp = m__io->read_bytes(16);
    }
    n_pubkey_index = true;
    if ( ((signature_first() == 170) && (is_auth())) ) {
        n_pubkey_index = false;
        m_pubkey_index = m__io->read_u4le();
    }
    n_len_name_auth = true;
    if ( ((signature_first() == 170) && (is_auth())) ) {
        n_len_name_auth = false;
        m_len_name_auth = m__io->read_u4le();
    }
    n_len_data_auth = true;
    if ( ((signature_first() == 170) && (is_auth())) ) {
        n_len_data_auth = false;
        m_len_data_auth = m__io->read_u4le();
    }
    n_vendor_guid = true;
    if (signature_first() == 170) {
        n_vendor_guid = false;
        m_vendor_guid = m__io->read_bytes(16);
    }
    n_name_auth = true;
    if ( ((signature_first() == 170) && (is_auth())) ) {
        n_name_auth = false;
        m_name_auth = m__io->read_bytes(len_name_auth());
    }
    n_data_auth = true;
    if ( ((signature_first() == 170) && (is_auth())) ) {
        n_data_auth = false;
        m_data_auth = m__io->read_bytes(len_data_auth());
    }
    n_invoke_end_offset_auth = true;
    if ( ((signature_first() == 170) && (is_auth()) && (end_offset_auth() >= 0)) ) {
        n_invoke_end_offset_auth = false;
        m_invoke_end_offset_auth = m__io->read_bytes(0);
    }
    n_alignment_padding_auth = true;
    if ( ((signature_first() == 170) && (is_auth())) ) {
        n_alignment_padding_auth = false;
        m_alignment_padding_auth = m__io->read_bytes(len_alignment_padding_auth());
    }
    n_name = true;
    if ( ((signature_first() == 170) && (!(is_auth()))) ) {
        n_name = false;
        m_name = m__io->read_bytes(len_name());
    }
    n_data = true;
    if ( ((signature_first() == 170) && (!(is_auth()))) ) {
        n_data = false;
        m_data = m__io->read_bytes(len_data());
    }
    n_invoke_end_offset = true;
    if ( ((signature_first() == 170) && (!(is_auth())) && (end_offset() >= 0)) ) {
        n_invoke_end_offset = false;
        m_invoke_end_offset = m__io->read_bytes(0);
    }
    n_alignment_padding = true;
    if ( ((signature_first() == 170) && (!(is_auth()))) ) {
        n_alignment_padding = false;
        m_alignment_padding = m__io->read_bytes(len_alignment_padding());
    }
}